

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O1

int __thiscall
crawler::Node::select
          (Node *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer *ppNVar1;
  pointer pNVar2;
  _Elt_pointer pNVar3;
  char cVar4;
  Node *childrenNode;
  pointer pNVar5;
  undefined4 in_register_00000034;
  vector<crawler::Node,_std::allocator<crawler::Node>_> *__x;
  queue<crawler::Node,_std::deque<crawler::Node,_std::allocator<crawler::Node>_>_> queue;
  Node root;
  Node tempNode;
  vector<crawler::Node,_std::allocator<crawler::Node>_> local_1b0;
  _Deque_base<crawler::Node,_std::allocator<crawler::Node>_> local_198;
  value_type local_140;
  Node local_b8;
  
  __x = (vector<crawler::Node,_std::allocator<crawler::Node>_> *)
        CONCAT44(in_register_00000034,__nfds);
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_198._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<crawler::Node,_std::allocator<crawler::Node>_>::_M_initialize_map(&local_198,0);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector(&local_140.children,__x);
  local_140.nodeType =
       *(NodeType *)
        &__x[1].super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
  std::__detail::__variant::
  _Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_140.nodeData,
                    (_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__x[1].super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
  local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __x[5].super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       __x[5].super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((pointer)local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppNVar1 = &(((pointer)
                  local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->children).
                 super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *(int *)ppNVar1 = *(int *)ppNVar1 + 1;
      UNLOCK();
    }
    else {
      ppNVar1 = &(((pointer)
                  local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->children).
                 super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *(int *)ppNVar1 = *(int *)ppNVar1 + 1;
    }
  }
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back
            ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198,&local_140);
  if (local_198._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_198._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pNVar3 = local_198._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                (&local_b8.children,
                 &(local_198._M_impl.super__Deque_impl_data._M_start._M_cur)->children);
      local_b8.nodeType = pNVar3->nodeType;
      std::__detail::__variant::
      _Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_b8.nodeData,
                        (_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&pNVar3->nodeData);
      local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pNVar3->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (pNVar3->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::deque<crawler::Node,_std::allocator<crawler::Node>_>::pop_front
                ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198);
      if (local_b8.nodeType == Element) {
        cVar4 = (**(code **)__readfds->fds_bits[0])(__readfds,&local_b8);
        if (cVar4 != '\0') {
          std::vector<crawler::Node,std::allocator<crawler::Node>>::emplace_back<crawler::Node&>
                    ((vector<crawler::Node,std::allocator<crawler::Node>> *)this,&local_b8);
        }
      }
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                (&local_1b0,&local_b8.children);
      pNVar5 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pNVar2 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1b0);
      if (pNVar2 != pNVar5) {
        std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
                  (&local_1b0,&local_b8.children);
        pNVar2 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pNVar5 = local_1b0.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start; pNVar5 != pNVar2;
            pNVar5 = pNVar5 + 1) {
          std::deque<crawler::Node,_std::allocator<crawler::Node>_>::push_back
                    ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198,pNVar5);
        }
        std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_1b0);
      }
      if (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__detail::__variant::
      _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_b8.nodeData);
      std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_b8.children);
    } while (local_198._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_198._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((pointer)local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_140.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&local_140.children);
  std::deque<crawler::Node,_std::allocator<crawler::Node>_>::~deque
            ((deque<crawler::Node,_std::allocator<crawler::Node>_> *)&local_198);
  return (int)this;
}

Assistant:

crawler::Nodes crawler::Node::select(Evaluator *evaluator) {
  return getElementsByPredicate([&evaluator](const Node &node) -> bool {
    return evaluator->matches(node);
  });
}